

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::dec_writer>
          *f)

{
  wchar_t wVar1;
  alignment aVar2;
  unsigned_long __n;
  wchar_t *pwVar3;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::dec_writer>
  *this_00;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::dec_writer>
  *in_RDX;
  align_spec *in_RSI;
  wchar_t **in_RDI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  type *it;
  size_t num_code_points;
  size_t size;
  uint width;
  size_t in_stack_ffffffffffffff88;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::dec_writer>
  *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  type local_48;
  type *local_40;
  type local_38;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *local_30;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *local_28;
  uint local_1c;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::dec_writer>
  *local_18;
  align_spec *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = align_spec::width(in_RSI);
  local_30 = (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
              *)basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                ::
                padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::dec_writer>
                ::size(local_18);
  local_28 = local_30;
  if (local_1c != 0) {
    local_30 = (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                *)basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  ::
                  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::dec_writer>
                  ::width(local_18);
  }
  if (local_30 <
      (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
       *)(ulong)local_1c) {
    local_48 = basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               ::reserve(local_30,in_stack_ffffffffffffff88);
    local_40 = &local_48;
    wVar1 = align_spec::fill(local_10);
    __n = (ulong)local_1c - (long)local_30;
    aVar2 = align_spec::align(local_10);
    if (aVar2 == ALIGN_RIGHT) {
      pwVar3 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                         ((wchar_t *)CONCAT44(wVar1,in_stack_ffffffffffffffb0),__n,
                          (wchar_t *)in_stack_ffffffffffffffa0);
      *local_40 = pwVar3;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
      ::operator()(in_stack_ffffffffffffffa0,in_RDI);
    }
    else {
      aVar2 = align_spec::align(local_10);
      if (aVar2 == ALIGN_CENTER) {
        this_00 = (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::dec_writer>
                   *)(__n >> 1);
        pwVar3 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           ((wchar_t *)CONCAT44(wVar1,in_stack_ffffffffffffffb0),__n,
                            (wchar_t *)this_00);
        *local_40 = pwVar3;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
        ::operator()(this_00,in_RDI);
        pwVar3 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           ((wchar_t *)CONCAT44(wVar1,in_stack_ffffffffffffffb0),__n,
                            (wchar_t *)this_00);
        *local_40 = pwVar3;
      }
      else {
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
        ::operator()(in_stack_ffffffffffffffa0,in_RDI);
        pwVar3 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           ((wchar_t *)CONCAT44(wVar1,in_stack_ffffffffffffffb0),__n,
                            (wchar_t *)in_stack_ffffffffffffffa0);
        *local_40 = pwVar3;
      }
    }
  }
  else {
    local_38 = basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               ::reserve(local_30,(size_t)local_18);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
    ::operator()(in_stack_ffffffffffffffa0,in_RDI);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }